

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Vec_Int_t * Io_ReadFins(Abc_Ntk_t *pNtk,char *pFileName,int fVerbose)

{
  Mio_Library_t *pMVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Abc_Nam_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Vec_Int_t *p_01;
  char *pcVar8;
  int iVar9;
  int fFound;
  FILE *local_438;
  Mio_Library_t *local_430;
  char *local_428;
  Vec_Int_t *local_420;
  char Buffer [1000];
  
  pMVar1 = (Mio_Library_t *)pNtk->pManFunc;
  local_438 = fopen(pFileName,"r");
  if (local_438 == (FILE *)0x0) {
    p_01 = (Vec_Int_t *)0x0;
    printf("Cannot open input file \"%s\" for reading.\n",pFileName);
  }
  else {
    local_430 = pMVar1;
    local_428 = pFileName;
    p = Abc_NamStart(1000,10);
    p_00 = Vec_IntAlloc(1000);
    Vec_IntPush(p_00,-1);
    for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar9);
      if (((pAVar6 != (Abc_Obj_t *)0x0) && (uVar2 = *(uint *)&pAVar6->field_0x14 & 0xf, uVar2 < 8))
         && ((0xa4U >> uVar2 & 1) != 0)) {
        pcVar7 = Abc_ObjName(pAVar6);
        Abc_NamStrFindOrAdd(p,pcVar7,&fFound);
        if (fFound != 0) {
          pcVar7 = Abc_ObjName(pAVar6);
          printf("The same name \"%s\" appears twice among CIs and internal nodes.\n",pcVar7);
          p_01 = (Vec_Int_t *)0x0;
          goto LAB_00278bb3;
        }
        Vec_IntPush(p_00,pAVar6->Id);
      }
    }
    iVar9 = p_00->nSize;
    iVar3 = Abc_NamObjNumMax(p);
    if (iVar9 != iVar3) {
      __assert_fail("Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xc3,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    p_01 = Vec_IntAlloc(1000);
    local_420 = p_01;
    Vec_IntPushTwo(p_01,-1,-1);
    iVar9 = 2;
    uVar2 = 0;
    while( true ) {
      pcVar7 = fgets(Buffer,1000,local_438);
      if ((pcVar7 == (char *)0x0) || (pcVar7 = strtok(Buffer," \n\r\t"), pcVar7 == (char *)0x0))
      break;
      uVar2 = uVar2 + 1;
      uVar4 = atoi(pcVar7);
      if (uVar2 != uVar4) {
        puts("Line numbers are not consecutive. Quitting.");
        Vec_IntFreeP(&local_420);
        p_01 = local_420;
        goto LAB_00278bb3;
      }
      pcVar7 = strtok((char *)0x0," \n\r\t");
      iVar3 = Abc_NamStrFind(p,pcVar7);
      if (iVar3 == 0) {
        printf("Cannot find object with name \"%s\".\n",pcVar7);
      }
      else {
        pcVar7 = strtok((char *)0x0," \n\r\t");
        if (((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) &&
           ((iVar5 = strcmp(pcVar7,"SA0"), iVar5 != 0 &&
            ((iVar5 = strcmp(pcVar7,"SA1"), iVar5 != 0 && (iVar5 = strcmp(pcVar7,"NEG"), iVar5 != 0)
             ))))) {
          iVar5 = Io_ReadFinTypeMapped(local_430,pcVar7);
        }
        else {
          iVar5 = Io_ReadFinType(pcVar7);
        }
        if (iVar5 == -100) {
          pAVar6 = Abc_NtkObj(pNtk,iVar3);
          pcVar8 = Abc_ObjName(pAVar6);
          printf("Cannot read type \"%s\" of object \"%s\".\n",pcVar7,pcVar8);
        }
        else {
          iVar3 = Vec_IntEntry(p_00,iVar3);
          Vec_IntPushTwo(p_01,iVar3,iVar5);
        }
      }
      iVar9 = iVar9 + 2;
    }
    if (p_01->nSize != iVar9) {
      __assert_fail("Vec_IntSize(vPairs) == 2 * nLines",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xed,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    printf("Finished reading %d lines from the fault list file \"%s\".\n",(ulong)uVar2,local_428);
    if (fVerbose != 0) {
      uVar2 = 1;
      for (iVar9 = 3; iVar9 < p_01->nSize; iVar9 = iVar9 + 2) {
        iVar3 = Vec_IntEntry(p_01,iVar9 + -1);
        iVar5 = Vec_IntEntry(p_01,iVar9);
        pAVar6 = Abc_NtkObj(pNtk,iVar3);
        pcVar7 = Abc_ObjName(pAVar6);
        pcVar8 = Io_WriteFinType(iVar5);
        printf("%-10d%-10s%-10s\n",(ulong)uVar2,pcVar7,pcVar8);
        uVar2 = uVar2 + 1;
      }
    }
LAB_00278bb3:
    Vec_IntFree(p_00);
    Abc_NamDeref(p);
    fclose(local_438);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Io_ReadFins( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    char Buffer[1000];
    Abc_Obj_t * pObj;
    Abc_Nam_t * pNam;
    Vec_Int_t * vMap; 
    Vec_Int_t * vPairs = NULL;
    int i, Type, iObj, fFound, nLines = 1;
    FILE * pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // map CI/node names into their IDs
    pNam = Abc_NamStart( 1000, 10 );
    vMap = Vec_IntAlloc( 1000 );
    Vec_IntPush( vMap, -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsCi(pObj) && !Abc_ObjIsNode(pObj) )
            continue;
        Abc_NamStrFindOrAdd( pNam, Abc_ObjName(pObj), &fFound );
        if ( fFound )
        {
            printf( "The same name \"%s\" appears twice among CIs and internal nodes.\n", Abc_ObjName(pObj) );
            goto finish;
        }
        Vec_IntPush( vMap, Abc_ObjId(pObj) );
    }
    assert( Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam) );
    // read file lines
    vPairs = Vec_IntAlloc( 1000 );
    Vec_IntPushTwo( vPairs, -1, -1 );
    while ( fgets(Buffer, 1000, pFile) != NULL )
    {
        // read line number
        char * pToken = strtok( Buffer, " \n\r\t" );
        if ( pToken == NULL )
            break;
        if ( nLines++ != atoi(pToken) )
        {
            printf( "Line numbers are not consecutive. Quitting.\n" );
            Vec_IntFreeP( &vPairs );
            goto finish;
        }
        // read object name and find its ID
        pToken = strtok( NULL, " \n\r\t" );
        iObj = Abc_NamStrFind( pNam, pToken );
        if ( !iObj )
        {
            printf( "Cannot find object with name \"%s\".\n", pToken );
            continue;
        }
        // read type
        pToken = strtok( NULL, " \n\r\t" );
        if ( Abc_NtkIsMappedLogic(pNtk) )
        {
            if ( !strcmp(pToken, "SA0") || !strcmp(pToken, "SA1") || !strcmp(pToken, "NEG") )
                Type = Io_ReadFinType( pToken );
            else
                Type = Io_ReadFinTypeMapped( pLib, pToken );
        }
        else
            Type = Io_ReadFinType( pToken );
        if ( Type == ABC_FIN_NONE )
        {
            printf( "Cannot read type \"%s\" of object \"%s\".\n", pToken, Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            continue;
        }
        Vec_IntPushTwo( vPairs, Vec_IntEntry(vMap, iObj), Type );
    }
    assert( Vec_IntSize(vPairs) == 2 * nLines );
    printf( "Finished reading %d lines from the fault list file \"%s\".\n", nLines - 1, pFileName );

    // verify the reader by printing the results
    if ( fVerbose )
        Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
            printf( "%-10d%-10s%-10s\n", i/2, Abc_ObjName(Abc_NtkObj(pNtk, iObj)), Io_WriteFinType(Type) );

finish:
    Vec_IntFree( vMap );
    Abc_NamDeref( pNam );
    fclose( pFile );
    return vPairs;
}